

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_align_byte(bitstream *str,vs_align_byte_mode mode)

{
  int iVar1;
  uint32_t local_24;
  uint32_t local_20;
  uint32_t tmp;
  uint32_t pad;
  vs_align_byte_mode mode_local;
  bitstream *str_local;
  
  tmp = mode;
  _pad = str;
  if (mode == VS_ALIGN_0) {
    local_20 = 0;
  }
  else if (mode == VS_ALIGN_1) {
    local_20 = (1 << ((char)str->bitpos + 1U & 0x1f)) - 1;
  }
  else {
    if (mode != VS_ALIGN_10) {
      abort();
    }
    local_20 = 1 << ((byte)str->bitpos & 0x1f);
  }
  if (str->dir == VS_ENCODE) {
    if (str->bitpos != 7) {
      str->curbyte = str->curbyte | (byte)local_20;
      iVar1 = vs_byte(str);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else {
    if (str->hasbyte != 0) {
      iVar1 = vs_u(str,&local_24,str->bitpos + 1);
      if (iVar1 != 0) {
        return 1;
      }
      if (local_24 != local_20) {
        fprintf(_stderr,"Byte alignment bits don\'t match!\n");
        return 1;
      }
    }
    _pad->hasbyte = 0;
    _pad->bitpos = 7;
  }
  return 0;
}

Assistant:

int vs_align_byte(struct bitstream *str, enum vs_align_byte_mode mode) {
	uint32_t pad;
	switch (mode) {
		case VS_ALIGN_0:
			pad = 0;
			break;
		case VS_ALIGN_1:
			pad = (1 << (str->bitpos + 1)) - 1;
			break;
		case VS_ALIGN_10:
			pad = 1 << str->bitpos;
			break;
		default:
			abort();
	}
	if (str->dir == VS_ENCODE) {
		if (str->bitpos != 7) {
			str->curbyte |= pad;
			if (vs_byte(str))
				return 1;
		}
	} else {
		if (str->hasbyte) {
			uint32_t tmp;
			if (vs_u(str, &tmp, str->bitpos + 1))
				return 1;
			if (tmp != pad) {
				fprintf(stderr, "Byte alignment bits don't match!\n");
				return 1;
			}
		}
		str->hasbyte = 0;
		str->bitpos = 7;
	}
	return 0;
}